

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

void __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>_>
::clean_dead_elements
          (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>_>
           *this)

{
  long lVar1;
  uintptr_t uVar2;
  ControlBlock *i_page;
  long *in_FS_OFFSET;
  bool bVar3;
  
  i_page = this->m_head;
  bVar3 = i_page == this->m_tail;
  if (!bVar3) {
    uVar2 = i_page->m_next;
    if (((uint)uVar2 & 3) == 2) {
      lVar1 = *in_FS_OFFSET;
      do {
        if ((uVar2 & 4) != 0) {
          basic_default_allocator<65536UL>::deallocate
                    ((basic_default_allocator<65536UL> *)this,(void *)i_page[2].m_next,
                     i_page[3].m_next,i_page[4].m_next,0);
        }
        if (0xffff < (uVar2 ^ (ulong)i_page)) {
          detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init
                    ();
          detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
          deallocate_page<(density::detail::page_allocation_type)0>
                    ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)(lVar1 + -0xc0),
                     i_page);
        }
        i_page = (ControlBlock *)(uVar2 & 0xfffffffffffffff8);
        bVar3 = this->m_tail == i_page;
        if (bVar3) goto LAB_00a8c925;
        uVar2 = i_page->m_next;
      } while (((uint)uVar2 & 3) == 2);
    }
    if ((!bVar3) && ((i_page->m_next & 3) == 2)) {
      density_tests::detail::assert_failed<>
                ("curr == m_tail || (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0xb88);
    }
  }
LAB_00a8c925:
  this->m_head = i_page;
  return;
}

Assistant:

void clean_dead_elements() noexcept
        {
            auto curr = m_head;
            while (curr != m_tail)
            {
                // break if the current block is busy or is not dead
                if (
                  (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead)
                {
                    break;
                }

                auto next =
                  reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
                if (curr->m_next & detail::Queue_External)
                {
                    auto result = address_add(curr, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
                    const auto & block = *static_cast<ExternalBlock *>(result);
                    ALLOCATOR_TYPE::deallocate(block.m_element, block.m_size, block.m_alignment);
                }

                if (!same_page(next, curr))
                {
                    allocator_type::deallocate_page(curr);
                }

                curr = next;
            }

            DENSITY_ASSERT_INTERNAL(
              curr == m_tail ||
              (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead);
            m_head = curr;
        }